

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtaptestlogger.cpp
# Opt level: O1

void __thiscall QTapTestLogger::endYamlish(QTapTestLogger *this)

{
  if (*(this->m_messages).buf != '\0') {
    QAbstractTestLogger::outputString(&this->super_QAbstractTestLogger,"  extensions:\n");
    QAbstractTestLogger::outputString(&this->super_QAbstractTestLogger,"    messages:\n");
    QAbstractTestLogger::outputString(&this->super_QAbstractTestLogger,(this->m_messages).buf);
    *(this->m_messages).buf = '\0';
  }
  QAbstractTestLogger::outputString(&this->super_QAbstractTestLogger,"  ...\n");
  return;
}

Assistant:

void QTapTestLogger::endYamlish()
{
    // Flush any accumulated messages:
    if (!m_messages.isEmpty()) {
        outputString(YAML_INDENT "extensions:\n");
        outputString(YAML_INDENT YAML_INDENT "messages:\n");
        outputString(m_messages.constData());
        m_messages.clear();
    }
    outputString(YAML_INDENT "...\n");
}